

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libformula-calc.c
# Opt level: O0

rpf_t * formula_output(stack_t *num,int *sp_num,stack_t *op,int *sp_op,int rank)

{
  int iVar1;
  int local_5c;
  int num_cnt;
  int sp_num2;
  rpf_t *rpf2_tmp;
  rpf_t rpf2;
  int sp_op2;
  int rank_local;
  int *sp_op_local;
  stack_t *op_local;
  int *sp_num_local;
  stack_t *num_local;
  
  rpf2.next._0_4_ = *sp_op;
  rpf2.next._4_4_ = rank;
  while( true ) {
    rpf2.next._0_4_ = (int)rpf2.next + -1;
    if ((int)rpf2.next < 0) {
      return (rpf_t *)num[*sp_num + -1].value;
    }
    _num_cnt = (rpf_t *)&rpf2_tmp;
    rpf2_tmp._0_4_ = 6;
    iVar1 = *(int *)((long)op[(int)rpf2.next].value + 0x18);
    if (*sp_num < iVar1) break;
    for (local_5c = *sp_num - iVar1; local_5c < *sp_num; local_5c = local_5c + 1) {
      if (num[local_5c].type == TYPE_RPF) {
        _num_cnt = rpf_join(_num_cnt,(rpf_t *)num[local_5c].value);
      }
      else {
        _num_cnt = rpf_push(_num_cnt,num + local_5c);
      }
    }
    *sp_num = *sp_num - iVar1;
    rpf_push(_num_cnt,op + (int)rpf2.next);
    *sp_op = *sp_op + -1;
    num[*sp_num].rank = 0;
    num[*sp_num].type = TYPE_RPF;
    num[*sp_num].value = rpf2.value;
    *sp_num = *sp_num + 1;
  }
  return (rpf_t *)0x0;
}

Assistant:

struct rpf_t *formula_output(struct stack_t *num, int *sp_num, struct stack_t *op, int *sp_op, int rank)
{
  /*{
		int i;
		printf("  op ");
		for(i = 0; i < *sp_op; i++)
			printf("%s ", ((struct operation_t*)op[i].value)->op);
		printf("\n  num ");
		for(i = 0; i < *sp_num; i++)
		{
			if(num[i].type == TYPE_RPF)
				printf("rpf ");
			else
				printf("%f ", *((double*)num[i].value));
		}
		printf("\n");
	}*/

  int sp_op2;
  for (sp_op2 = *sp_op - 1; sp_op2 >= 0; sp_op2--)
  {
    struct rpf_t rpf2, *rpf2_tmp;
    int sp_num2;

    rpf2_tmp = &rpf2;
    rpf2.type = TYPE_START;

    int num_cnt;
    num_cnt = ((struct operation_t *)op[sp_op2].value)->narg;
    if (num_cnt > *sp_num)
      return NULL;
    for (sp_num2 = *sp_num - num_cnt; sp_num2 < *sp_num; sp_num2++)
    {
      switch (num[sp_num2].type)
      {
        case TYPE_RPF:
          rpf2_tmp = rpf_join(rpf2_tmp, num[sp_num2].value);
          //printf(" rpf");
          break;
        default:
          rpf2_tmp = rpf_push(rpf2_tmp, &num[sp_num2]);
          //printf("%f ", *((double*)num[sp_num2].value));
          break;
      }
    }
    //printf("\n");
    (*sp_num) -= num_cnt;
    rpf2_tmp = rpf_push(rpf2_tmp, &op[sp_op2]);
    (*sp_op)--;

    num[*sp_num].rank = 0;
    num[*sp_num].type = TYPE_RPF;
    num[*sp_num].value = rpf2.next;
    (*sp_num)++;

    //formula_print(stdout, &rpf2);
    //printf("\n");
  }
  return num[*sp_num - 1].value;
}